

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::DTDElementDecl::getFormattedContentModel(DTDElementDecl *this)

{
  XMLCh *pXVar1;
  
  if (this->fFormattedModel != (XMLCh *)0x0) {
    return this->fFormattedModel;
  }
  pXVar1 = formatContentModel(this);
  this->fFormattedModel = pXVar1;
  return pXVar1;
}

Assistant:

const XMLCh*
DTDElementDecl::getFormattedContentModel() const
{
    //
    //  If its not already built, then call the protected virtual method
    //  to allow the derived class to build it (since only it knows.)
    //  Otherwise, just return the previously formatted methods.
    //
    //  Since we are faulting this in, within a const getter, we have to
    //  cast off the const-ness.
    //
    if (!fFormattedModel)
        ((DTDElementDecl*)this)->fFormattedModel = formatContentModel();

    return fFormattedModel;
}